

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O1

void __thiscall
Memory::LargeHeapBlock::FinishPartialCollect(LargeHeapBlock *this,Recycler *recycler)

{
  LargeObjectHeader *header;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ulong uVar4;
  uint *address;
  
  if (this->hasPartialFreeObjects == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x83b,"(this->hasPartialFreeObjects)","this->hasPartialFreeObjects");
    if (!bVar2) {
LAB_006f3d9d:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (this->allocCount != 0) {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar4 = 0;
    do {
      header = (LargeObjectHeader *)(&this[1].super_HeapBlock._vptr_HeapBlock)[uVar4];
      if (header != (LargeObjectHeader *)0x0) {
        bVar2 = IsPartialSweptHeader(this,header);
        if (bVar2) {
          address = (uint *)((ulong)header & 0xfffffffffffffffe);
          if (uVar4 != *address) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar3 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                               ,0x843,"(header->objectIndex == i)","header->objectIndex == i");
            if (!bVar2) goto LAB_006f3d9d;
            *puVar3 = 0;
          }
          (&this[1].super_HeapBlock._vptr_HeapBlock)[uVar4] = (_func_int **)0x0;
          FillFreeMemory(this,recycler,address,*(long *)(address + 2) + 0x20);
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->allocCount);
  }
  this->hasPartialFreeObjects = false;
  return;
}

Assistant:

void
LargeHeapBlock::FinishPartialCollect(Recycler * recycler)
{
    Assert(this->hasPartialFreeObjects);
    for (uint i = 0; i < allocCount; i++)
    {
        LargeObjectHeader * header = this->HeaderList()[i];

        if (header != nullptr && IsPartialSweptHeader(header))
        {
            header = (LargeObjectHeader *)((size_t)header & ~PartialFreeBit);
            Assert(header->objectIndex == i);
            this->HeaderList()[i] = nullptr;
            FillFreeMemory(recycler, header, sizeof(LargeObjectHeader) + header->objectSize);
        }
    }
    DebugOnly(this->hasPartialFreeObjects = false);
}